

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argengine.cpp
# Opt level: O0

ArgumentAndValue * __thiscall
juzzlin::Argengine::Impl::splitAssignmentFormat(Impl *this,string *arg)

{
  bool bVar1;
  long lVar2;
  ulong in_RDX;
  ArgumentAndValue *in_RDI;
  string *unaff_retaddr;
  Impl *in_stack_00000008;
  size_type valueLength;
  OptionDefinitionSP match;
  size_type pos;
  string assignmentFormatArg;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff30;
  ArgumentAndValue *this_00;
  string local_b0 [16];
  char (*in_stack_ffffffffffffff60) [1];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int iVar3;
  __shared_ptr local_80 [32];
  string local_60 [32];
  long local_40;
  ulong local_18;
  
  this_00 = in_RDI;
  local_18 = in_RDX;
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc8);
  local_40 = std::__cxx11::string::find((char)local_18,0x3d);
  if (local_40 != -1) {
    std::__cxx11::string::substr((ulong)local_60,local_18);
    in_stack_ffffffffffffff30 =
         (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)&stack0xffffffffffffffc8;
    std::__cxx11::string::operator=((string *)in_stack_ffffffffffffff30,local_60);
    std::__cxx11::string::~string(local_60);
    getOptionDefinition(in_stack_00000008,unaff_retaddr);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_80);
    if (bVar1) {
      std::
      __shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x136b5a);
      bVar1 = std::function::operator_cast_to_bool
                        ((function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)in_stack_ffffffffffffff30);
      if (!bVar1) goto LAB_00136c51;
      lVar2 = std::__cxx11::string::size();
      if (lVar2 == local_40 + 1) {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_char_(&)[1],_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
        iVar3 = 1;
      }
      else {
        std::__cxx11::string::substr((ulong)local_b0,local_18);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  (this_00,&in_RDI->first,&in_stack_ffffffffffffff30->first);
        std::__cxx11::string::~string(local_b0);
        iVar3 = 1;
      }
    }
    else {
LAB_00136c51:
      iVar3 = 0;
    }
    std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>::~shared_ptr
              ((shared_ptr<juzzlin::Argengine::Impl::OptionDefinition> *)0x136c63);
    if (iVar3 != 0) goto LAB_00136c8f;
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_ffffffffffffff30);
LAB_00136c8f:
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return this_00;
}

Assistant:

ArgumentAndValue splitAssignmentFormat(const std::string & arg) const
    {
        std::string assignmentFormatArg;
        if (const auto pos = arg.find('='); pos != arg.npos) {
            assignmentFormatArg = arg.substr(0, pos);
            if (const auto match = getOptionDefinition(assignmentFormatArg); match && match->singleStringCallback) {
                if (const auto valueLength = arg.size() - (pos + 1); !valueLength) {
                    return { assignmentFormatArg, "" };
                } else {
                    return { assignmentFormatArg, arg.substr(pos + 1, valueLength) };
                }
            }
        }
        return {};
    }